

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O2

void __thiscall QAbstractSocketPrivate::~QAbstractSocketPrivate(QAbstractSocketPrivate *this)

{
  *(undefined ***)this = &PTR__QAbstractSocketPrivate_002cb1d0;
  (this->super_QAbstractSocketEngineReceiver)._vptr_QAbstractSocketEngineReceiver =
       (_func_int **)&PTR__QAbstractSocketPrivate_002cb270;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->protocolTag).d);
  QNetworkProxy::~QNetworkProxy(&this->proxyInUse);
  QNetworkProxy::~QNetworkProxy(&this->proxy);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->peerName).d);
  QHostAddress::~QHostAddress(&this->peerAddress);
  QHostAddress::~QHostAddress(&this->localAddress);
  QArrayDataPointer<QHostAddress>::~QArrayDataPointer(&(this->addresses).d);
  QHostAddress::~QHostAddress(&this->host);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->hostName).d);
  QIODevicePrivate::~QIODevicePrivate(&this->super_QIODevicePrivate);
  return;
}

Assistant:

QAbstractSocketPrivate::~QAbstractSocketPrivate()
{
}